

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__encode_png_line
               (uchar *pixels,int stride_bytes,int width,int height,int y,int n,int filter_type,
               char *line_buffer)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uchar uVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  
  piVar10 = stbiw__encode_png_line::mapping;
  if (y == 0) {
    piVar10 = stbiw__encode_png_line::firstmap;
  }
  iVar6 = ~y + height;
  if (stbi__flip_vertically_on_write == 0) {
    iVar6 = y;
  }
  iVar1 = piVar10[filter_type];
  iVar5 = -stride_bytes;
  if (stbi__flip_vertically_on_write == 0) {
    iVar5 = stride_bytes;
  }
  iVar6 = iVar6 * stride_bytes;
  lVar4 = (long)iVar5;
  uVar12 = 0;
  uVar11 = 0;
  if (0 < n) {
    uVar11 = (ulong)(uint)n;
  }
  lVar7 = iVar6 - lVar4;
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    switch(iVar1) {
    case 0:
    case 1:
    case 5:
    case 6:
      uVar8 = pixels[uVar12 + (long)iVar6];
      break;
    case 2:
      uVar8 = pixels[uVar12 + (long)iVar6] - pixels[uVar12 + lVar7];
      break;
    case 3:
      uVar8 = pixels[uVar12 + (long)iVar6];
      bVar3 = pixels[uVar12 + lVar7] >> 1;
      goto LAB_0013b418;
    case 4:
      uVar8 = pixels[uVar12 + (long)iVar6];
      bVar3 = stbiw__paeth(0,(uint)pixels[uVar12 + lVar7],0);
LAB_0013b418:
      uVar8 = uVar8 - bVar3;
      break;
    default:
      goto switchD_0013b3d3_default;
    }
    line_buffer[uVar12] = uVar8;
switchD_0013b3d3_default:
  }
  lVar9 = (long)n;
  lVar7 = lVar9;
  do {
    if (width * n <= lVar7) {
      return;
    }
    switch(iVar1) {
    case 0:
      uVar8 = pixels[lVar7 + iVar6];
      break;
    case 1:
    case 6:
      uVar8 = pixels[lVar7 + iVar6];
      lVar2 = lVar9;
      goto LAB_0013b4f2;
    case 2:
      uVar8 = pixels[lVar7 + iVar6];
      lVar2 = lVar4;
LAB_0013b4f2:
      uVar8 = uVar8 - pixels[(lVar7 - lVar2) + (long)iVar6];
      break;
    case 3:
      uVar8 = pixels[lVar7 + iVar6] -
              (char)((uint)pixels[(lVar7 - lVar4) + (long)iVar6] +
                     (uint)pixels[(lVar7 - lVar9) + (long)iVar6] >> 1);
      break;
    case 4:
      uVar8 = pixels[lVar7 + iVar6];
      bVar3 = stbiw__paeth((uint)pixels[(lVar7 - lVar9) + (long)iVar6],
                           (uint)pixels[(lVar7 - lVar4) + (long)iVar6],
                           (uint)pixels[((lVar7 - lVar4) - lVar9) + (long)iVar6]);
      goto LAB_0013b4db;
    case 5:
      uVar8 = pixels[lVar7 + iVar6];
      bVar3 = pixels[(lVar7 - lVar9) + (long)iVar6] >> 1;
LAB_0013b4db:
      uVar8 = uVar8 - bVar3;
      break;
    default:
      goto switchD_0013b459_default;
    }
    line_buffer[lVar7] = uVar8;
switchD_0013b459_default:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static void stbiw__encode_png_line(unsigned char *pixels, int stride_bytes, int width, int height, int y, int n, int filter_type, signed char *line_buffer)
{
   static int mapping[] = { 0,1,2,3,4 };
   static int firstmap[] = { 0,1,0,5,6 };
   int *mymap = (y != 0) ? mapping : firstmap;
   int i;
   int type = mymap[filter_type];
   unsigned char *z = pixels + stride_bytes * (stbi__flip_vertically_on_write ? height-1-y : y);
   int signed_stride = stbi__flip_vertically_on_write ? -stride_bytes : stride_bytes;
   for (i = 0; i < n; ++i) {
      switch (type) {
         case 0: line_buffer[i] = z[i]; break;
         case 1: line_buffer[i] = z[i]; break;
         case 2: line_buffer[i] = z[i] - z[i-signed_stride]; break;
         case 3: line_buffer[i] = z[i] - (z[i-signed_stride]>>1); break;
         case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-signed_stride],0)); break;
         case 5: line_buffer[i] = z[i]; break;
         case 6: line_buffer[i] = z[i]; break;
      }
   }
   for (i=n; i < width*n; ++i) {
      switch (type) {
         case 0: line_buffer[i] = z[i]; break;
         case 1: line_buffer[i] = z[i] - z[i-n]; break;
         case 2: line_buffer[i] = z[i] - z[i-signed_stride]; break;
         case 3: line_buffer[i] = z[i] - ((z[i-n] + z[i-signed_stride])>>1); break;
         case 4: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-signed_stride], z[i-signed_stride-n]); break;
         case 5: line_buffer[i] = z[i] - (z[i-n]>>1); break;
         case 6: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
      }
   }
}